

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fossilize_feature_filter.cpp
# Opt level: O0

bool __thiscall
Fossilize::FeatureFilter::Impl::pipeline_stage_mask_is_supported
          (Impl *this,VkPipelineStageFlags2 stages)

{
  size_type sVar1;
  bool bVar2;
  allocator local_79;
  key_type local_78;
  byte local_53;
  byte local_52;
  allocator local_51;
  key_type local_50;
  undefined8 local_30;
  VkPipelineStageFlags2 supported_flags;
  VkPipelineStageFlags2 sync2_stages;
  VkPipelineStageFlags2 stages_local;
  Impl *this_local;
  
  if ((stages == 0) && ((this->features).synchronization2.synchronization2 == 0)) {
    this_local._7_1_ = false;
  }
  else {
    supported_flags = 0x7f00000000;
    local_30 = 0x7f7fe7ffff;
    if ((stages & 0xffffff8080180000) == 0) {
      local_52 = 0;
      local_53 = 0;
      bVar2 = false;
      sync2_stages = stages;
      stages_local = (VkPipelineStageFlags2)this;
      if ((stages & 0x4000000) != 0) {
        std::allocator<char>::allocator();
        local_52 = 1;
        std::__cxx11::string::string((string *)&local_50,"VK_KHR_video_decode_queue",&local_51);
        local_53 = 1;
        sVar1 = std::
                unordered_set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                ::count(&this->enabled_extensions,&local_50);
        bVar2 = sVar1 == 0;
      }
      if ((local_53 & 1) != 0) {
        std::__cxx11::string::~string((string *)&local_50);
      }
      if ((local_52 & 1) != 0) {
        std::allocator<char>::~allocator((allocator<char> *)&local_51);
      }
      if (bVar2) {
        this_local._7_1_ = false;
      }
      else {
        bVar2 = false;
        if ((sync2_stages & 0x8000000) != 0) {
          std::allocator<char>::allocator();
          std::__cxx11::string::string((string *)&local_78,"VK_KHR_video_encode_queue",&local_79);
          sVar1 = std::
                  unordered_set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  ::count(&this->enabled_extensions,&local_78);
          bVar2 = sVar1 == 0;
          std::__cxx11::string::~string((string *)&local_78);
          std::allocator<char>::~allocator((allocator<char> *)&local_79);
        }
        if (bVar2) {
          this_local._7_1_ = false;
        }
        else if (((sync2_stages & 0x1000000) == 0) ||
                ((this->features).transform_feedback.transformFeedback != 0)) {
          if (((sync2_stages & 0x40000) == 0) ||
             ((this->features).conditional_rendering.conditionalRendering != 0)) {
            if (((sync2_stages & 0x2000000) == 0) ||
               ((this->features).acceleration_structure.accelerationStructure != 0)) {
              if (((sync2_stages & 0x200000) == 0) ||
                 ((this->features).ray_tracing_pipeline.rayTracingPipeline != 0)) {
                if (((sync2_stages & 0x800000) == 0) ||
                   ((this->features).fragment_density.fragmentDensityMap != 0)) {
                  if (((sync2_stages & 0x400000) == 0) ||
                     ((this->features).fragment_shading_rate.attachmentFragmentShadingRate != 0)) {
                    if (((sync2_stages & 0x7f00000000) == 0) ||
                       ((this->features).synchronization2.synchronization2 != 0)) {
                      if (((sync2_stages & 0x10000000) == 0) ||
                         ((this->features).ray_tracing_maintenance1.rayTracingMaintenance1 != 0)) {
                        if (((sync2_stages & 0x40000000) == 0) ||
                           ((this->features).opacity_micromap.micromap != 0)) {
                          if (((sync2_stages & 0x20000) == 0) ||
                             (((this->features).device_generated_commands_nv.deviceGeneratedCommands
                               != 0 || ((this->features).device_generated_commands.
                                        deviceGeneratedCommands != 0)))) {
                            if (((sync2_stages & 0x20000000) == 0) ||
                               ((this->features).optical_flow_nv.opticalFlow != 0)) {
                              this_local._7_1_ = true;
                            }
                            else {
                              this_local._7_1_ = false;
                            }
                          }
                          else {
                            this_local._7_1_ = false;
                          }
                        }
                        else {
                          this_local._7_1_ = false;
                        }
                      }
                      else {
                        this_local._7_1_ = false;
                      }
                    }
                    else {
                      this_local._7_1_ = false;
                    }
                  }
                  else {
                    this_local._7_1_ = false;
                  }
                }
                else {
                  this_local._7_1_ = false;
                }
              }
              else {
                this_local._7_1_ = false;
              }
            }
            else {
              this_local._7_1_ = false;
            }
          }
          else {
            this_local._7_1_ = false;
          }
        }
        else {
          this_local._7_1_ = false;
        }
      }
    }
    else {
      this_local._7_1_ = false;
    }
  }
  return this_local._7_1_;
}

Assistant:

bool FeatureFilter::Impl::pipeline_stage_mask_is_supported(VkPipelineStageFlags2 stages) const
{
	if (stages == VK_PIPELINE_STAGE_NONE && features.synchronization2.synchronization2 == VK_FALSE)
		return false;

	constexpr VkPipelineStageFlags2 sync2_stages =
			VK_PIPELINE_STAGE_2_COPY_BIT |
			VK_PIPELINE_STAGE_2_CLEAR_BIT |
			VK_PIPELINE_STAGE_2_RESOLVE_BIT |
			VK_PIPELINE_STAGE_2_BLIT_BIT |
			VK_PIPELINE_STAGE_2_INDEX_INPUT_BIT |
			VK_PIPELINE_STAGE_2_PRE_RASTERIZATION_SHADERS_BIT |
			VK_PIPELINE_STAGE_2_VERTEX_ATTRIBUTE_INPUT_BIT;

	constexpr VkPipelineStageFlags2 supported_flags =
			VK_PIPELINE_STAGE_TOP_OF_PIPE_BIT |
			VK_PIPELINE_STAGE_DRAW_INDIRECT_BIT |
			VK_PIPELINE_STAGE_VERTEX_INPUT_BIT |
			VK_PIPELINE_STAGE_VERTEX_SHADER_BIT |
			VK_PIPELINE_STAGE_TESSELLATION_CONTROL_SHADER_BIT |
			VK_PIPELINE_STAGE_TESSELLATION_EVALUATION_SHADER_BIT |
			VK_PIPELINE_STAGE_GEOMETRY_SHADER_BIT |
			VK_PIPELINE_STAGE_FRAGMENT_SHADER_BIT |
			VK_PIPELINE_STAGE_EARLY_FRAGMENT_TESTS_BIT |
			VK_PIPELINE_STAGE_LATE_FRAGMENT_TESTS_BIT |
			VK_PIPELINE_STAGE_COLOR_ATTACHMENT_OUTPUT_BIT |
			VK_PIPELINE_STAGE_COMPUTE_SHADER_BIT |
			VK_PIPELINE_STAGE_TRANSFER_BIT |
			VK_PIPELINE_STAGE_BOTTOM_OF_PIPE_BIT |
			VK_PIPELINE_STAGE_HOST_BIT |
			VK_PIPELINE_STAGE_ALL_GRAPHICS_BIT |
			VK_PIPELINE_STAGE_ALL_COMMANDS_BIT |
			VK_PIPELINE_STAGE_2_VIDEO_DECODE_BIT_KHR |
			VK_PIPELINE_STAGE_2_VIDEO_ENCODE_BIT_KHR |
			VK_PIPELINE_STAGE_TRANSFORM_FEEDBACK_BIT_EXT |
			VK_PIPELINE_STAGE_CONDITIONAL_RENDERING_BIT_EXT |
			VK_PIPELINE_STAGE_ACCELERATION_STRUCTURE_BUILD_BIT_KHR |
			VK_PIPELINE_STAGE_RAY_TRACING_SHADER_BIT_KHR |
			VK_PIPELINE_STAGE_FRAGMENT_DENSITY_PROCESS_BIT_EXT |
			VK_PIPELINE_STAGE_FRAGMENT_SHADING_RATE_ATTACHMENT_BIT_KHR |
			VK_PIPELINE_STAGE_2_ACCELERATION_STRUCTURE_COPY_BIT_KHR |
			VK_PIPELINE_STAGE_2_MICROMAP_BUILD_BIT_EXT |
			VK_PIPELINE_STAGE_COMMAND_PREPROCESS_BIT_EXT |
			VK_PIPELINE_STAGE_2_OPTICAL_FLOW_BIT_NV |
			sync2_stages;

	if (stages & ~supported_flags)
		return false;

	if ((stages & VK_PIPELINE_STAGE_2_VIDEO_DECODE_BIT_KHR) != 0 &&
	    enabled_extensions.count(VK_KHR_VIDEO_DECODE_QUEUE_EXTENSION_NAME) == 0)
		return false;

	if ((stages & VK_PIPELINE_STAGE_2_VIDEO_ENCODE_BIT_KHR) != 0 &&
	    enabled_extensions.count(VK_KHR_VIDEO_ENCODE_QUEUE_EXTENSION_NAME) == 0)
		return false;

	if ((stages & VK_PIPELINE_STAGE_TRANSFORM_FEEDBACK_BIT_EXT) != 0 &&
	    features.transform_feedback.transformFeedback == VK_FALSE)
		return false;

	if ((stages & VK_PIPELINE_STAGE_CONDITIONAL_RENDERING_BIT_EXT) != 0 &&
	    features.conditional_rendering.conditionalRendering == VK_FALSE)
		return false;

	if ((stages & VK_PIPELINE_STAGE_ACCELERATION_STRUCTURE_BUILD_BIT_KHR) != 0 &&
	    features.acceleration_structure.accelerationStructure == VK_FALSE)
		return false;

	if ((stages & VK_PIPELINE_STAGE_RAY_TRACING_SHADER_BIT_KHR) != 0 &&
	    features.ray_tracing_pipeline.rayTracingPipeline == VK_FALSE)
		return false;

	if ((stages & VK_PIPELINE_STAGE_FRAGMENT_DENSITY_PROCESS_BIT_EXT) != 0 &&
	    features.fragment_density.fragmentDensityMap == VK_FALSE)
		return false;

	if ((stages & VK_PIPELINE_STAGE_FRAGMENT_SHADING_RATE_ATTACHMENT_BIT_KHR) != 0 &&
	    features.fragment_shading_rate.attachmentFragmentShadingRate == VK_FALSE)
		return false;

	if ((stages & sync2_stages) != 0 && features.synchronization2.synchronization2 == VK_FALSE)
		return false;

	if ((stages & VK_PIPELINE_STAGE_2_ACCELERATION_STRUCTURE_COPY_BIT_KHR) != 0 &&
	    features.ray_tracing_maintenance1.rayTracingMaintenance1 == VK_FALSE)
		return false;

	if ((stages & VK_PIPELINE_STAGE_2_MICROMAP_BUILD_BIT_EXT) != 0 &&
	    features.opacity_micromap.micromap == VK_FALSE)
		return false;

	if ((stages & VK_PIPELINE_STAGE_COMMAND_PREPROCESS_BIT_EXT) != 0 &&
	    features.device_generated_commands_nv.deviceGeneratedCommands == VK_FALSE &&
	    features.device_generated_commands.deviceGeneratedCommands == VK_FALSE)
		return false;

	if ((stages & VK_PIPELINE_STAGE_2_OPTICAL_FLOW_BIT_NV) != 0 &&
	    features.optical_flow_nv.opticalFlow == VK_FALSE)
		return false;

	return true;
}